

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppcnn.cpp
# Opt level: O2

pair<std::vector<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
* __thiscall
CppCNN::preprocess_data
          (pair<std::vector<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
           *__return_storage_ptr__,CppCNN *this,ImageVolume *examples,VectorXd *labels)

{
  ostream *poVar1;
  ImageVolume examples_norm;
  MatrixXd labels_mat;
  ImageVolume local_50;
  MatrixXd local_38;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"preprocess_data");
  std::endl<char,std::char_traits<char>>(poVar1);
  build_labels_matrix(&local_38,this,labels);
  normalize_examples(&local_50,this,examples);
  std::
  pair<std::vector<std::vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>_>_>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>
  ::
  pair<std::vector<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>_>_&,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_&,_true>
            (__return_storage_ptr__,&local_50,&local_38);
  std::
  vector<std::vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>_>_>
  ::~vector(&local_50);
  free(local_38.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  return __return_storage_ptr__;
}

Assistant:

pair<ImageVolume, MatrixXd> CppCNN::preprocess_data(const ImageVolume& examples, const VectorXd& labels) {
	cout << __FUNCTION__ << endl;

	auto labels_mat = build_labels_matrix(labels);
	auto examples_norm = normalize_examples(examples);

	return make_pair(examples_norm, labels_mat);
}